

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

int __thiscall QDateTimeEditPrivate::init(QDateTimeEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QDate date;
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  QDateTimeEditPrivate *str;
  QDateTimeEdit *this_00;
  QString *format;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QDateTimeEdit *q;
  QDateTimeEditPrivate *in_stack_fffffffffffffec0;
  QDateTimeEditPrivate *in_stack_fffffffffffffec8;
  QString *in_stack_fffffffffffffed0;
  QDateTimeEditPrivate *this_01;
  QStyleOption *opt;
  SubElement element;
  undefined4 in_stack_fffffffffffffee8;
  QLatin1StringView in_stack_fffffffffffffef0;
  QString *local_f8;
  QDateTimeEdit *in_stack_ffffffffffffff18;
  QDate local_a0;
  QDateTime local_98 [56];
  undefined8 local_60;
  QDateTime local_58 [8];
  undefined1 local_50 [40];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = (QDateTimeEditPrivate *)q_func(this);
  opt = (QStyleOption *)local_50;
  QDate::QDate((QDate *)opt,2000,1,1);
  uVar2 = QDate::year();
  *(undefined4 *)&this->field_0x3e4 = uVar2;
  iVar3 = ::QVariant::userType((QVariant *)0x55774f);
  if (iVar3 == 0xe) {
    local_60 = ::QVariant::toDate();
    QDate::startOfDay((QTimeZone *)local_58);
    ::QVariant::QVariant(&local_28,local_58);
    ::QVariant::operator=
              ((QVariant *)in_stack_fffffffffffffec8,(QVariant *)in_stack_fffffffffffffec0);
    ::QVariant::~QVariant(&local_28);
    QDateTime::~QDateTime(local_58);
    updateTimeZone(in_stack_fffffffffffffec8);
    QDateTimeEdit::setDisplayFormat(in_stack_ffffffffffffff18,local_f8);
    bVar1 = QList<QDateTimeParser::SectionNode>::isEmpty
                      ((QList<QDateTimeParser::SectionNode> *)0x55782d);
    if (bVar1) {
      this_01 = str;
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
      this_00 = (QDateTimeEdit *)QVar4.m_size;
      QString::QString((QString *)this_01,in_stack_fffffffffffffef0);
      QDateTimeEdit::setDisplayFormat(this_00,local_f8);
      QString::~QString((QString *)0x55788e);
    }
  }
  else if (iVar3 == 0xf) {
    QDate::QDate(&local_a0,2000,1,1);
    ::QVariant::toTime();
    date.jd._4_4_ = iVar3;
    date.jd._0_4_ = in_stack_fffffffffffffee8;
    dateTimeValue(in_stack_fffffffffffffec0,date,(QTime)(int)((ulong)this >> 0x20));
    ::QVariant::QVariant((QVariant *)(local_50 + 8),local_98);
    ::QVariant::operator=
              ((QVariant *)in_stack_fffffffffffffec8,(QVariant *)in_stack_fffffffffffffec0);
    ::QVariant::~QVariant((QVariant *)(local_50 + 8));
    QDateTime::~QDateTime(local_98);
    updateTimeZone(in_stack_fffffffffffffec8);
    QDateTimeEdit::setDisplayFormat(in_stack_ffffffffffffff18,local_f8);
    bVar1 = QList<QDateTimeParser::SectionNode>::isEmpty
                      ((QList<QDateTimeParser::SectionNode> *)0x557a06);
    if (bVar1) {
      in_stack_fffffffffffffec0 = str;
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffec8,(size_t)str);
      QString::QString(in_stack_fffffffffffffed0,QVar4);
      QDateTimeEdit::setDisplayFormat(in_stack_ffffffffffffff18,local_f8);
      QString::~QString((QString *)0x557a67);
    }
  }
  else if (iVar3 == 0x10) {
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,(QVariant *)ctx);
    updateTimeZone(in_stack_fffffffffffffec8);
    QDateTimeEdit::setDisplayFormat(in_stack_ffffffffffffff18,local_f8);
    bVar1 = QList<QDateTimeParser::SectionNode>::isEmpty
                      ((QList<QDateTimeParser::SectionNode> *)0x5578de);
    if (bVar1) {
      in_stack_fffffffffffffec8 = str;
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)str,(size_t)in_stack_fffffffffffffec0);
      format = (QString *)QVar4.m_data;
      QString::QString(in_stack_fffffffffffffed0,in_stack_fffffffffffffef0);
      QDateTimeEdit::setDisplayFormat(in_stack_ffffffffffffff18,format);
      QString::~QString((QString *)0x55793f);
    }
  }
  element = (SubElement)((ulong)this >> 0x20);
  QFlags<Qt::InputMethodHint>::QFlags
            ((QFlags<Qt::InputMethodHint> *)in_stack_fffffffffffffec0,
             (InputMethodHint)((ulong)str >> 0x20));
  QWidget::setInputMethodHints
            ((QWidget *)in_stack_fffffffffffffec8,
             (QFlagsStorageHelper<Qt::InputMethodHint,_4>)SUB84((ulong)opt >> 0x20,0));
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)CONCAT44(iVar3,in_stack_fffffffffffffee8),element,opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QDateTimeEditPrivate::init(const QVariant &var)
{
    Q_Q(QDateTimeEdit);
    defaultCenturyStart = QDATETIMEEDIT_DATE_INITIAL.year();
    switch (var.userType()) {
    case QMetaType::QDate:
        value = var.toDate().startOfDay(timeZone);
        updateTimeZone();
        q->setDisplayFormat(defaultDateFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy"_L1);
        break;
    case QMetaType::QDateTime:
        value = var;
        updateTimeZone();
        q->setDisplayFormat(defaultDateTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy hh:mm:ss"_L1);
        break;
    case QMetaType::QTime:
        value = dateTimeValue(QDATETIMEEDIT_DATE_INITIAL, var.toTime());
        updateTimeZone();
        q->setDisplayFormat(defaultTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("hh:mm:ss"_L1);
        break;
    default:
        Q_ASSERT_X(0, "QDateTimeEditPrivate::init", "Internal error");
        break;
    }
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setCalendarPopup(true);
#endif
    q->setInputMethodHints(Qt::ImhPreferNumbers);
    setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
}